

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemview.cpp
# Opt level: O1

void QAbstractItemView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  DragDropMode *pDVar1;
  long *plVar2;
  QSize *size;
  long lVar3;
  undefined1 uVar4;
  DragDropMode DVar5;
  undefined8 *puVar6;
  QArrayData **ppQVar7;
  InterfaceType *pIVar8;
  int iVar9;
  long in_FS_OFFSET;
  QArrayData *local_48;
  void *pvStack_40;
  undefined8 local_38;
  long local_30;
  
  ppQVar7 = &local_48;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    pvStack_40 = _a[1];
    local_48 = (QArrayData *)0x0;
    iVar9 = 0;
    goto LAB_0054766d;
  case 1:
    pvStack_40 = _a[1];
    local_48 = (QArrayData *)0x0;
    iVar9 = 1;
    ppQVar7 = &local_48;
    goto LAB_0054766d;
  case 2:
    pvStack_40 = _a[1];
    local_48 = (QArrayData *)0x0;
    iVar9 = 2;
    ppQVar7 = &local_48;
    goto LAB_0054766d;
  case 3:
    pvStack_40 = _a[1];
    local_48 = (QArrayData *)0x0;
    iVar9 = 3;
    ppQVar7 = &local_48;
    goto LAB_0054766d;
  case 4:
    pvStack_40 = _a[1];
    local_48 = (QArrayData *)0x0;
    iVar9 = 4;
    ppQVar7 = &local_48;
    goto LAB_0054766d;
  case 5:
    iVar9 = 5;
    ppQVar7 = (QArrayData **)(void **)0x0;
    goto LAB_0054766d;
  case 6:
    pvStack_40 = _a[1];
    local_48 = (QArrayData *)0x0;
    iVar9 = 6;
    ppQVar7 = &local_48;
LAB_0054766d:
    QMetaObject::activate(_o,&staticMetaObject,iVar9,ppQVar7);
    break;
  case 7:
    (**(code **)(*(long *)_o + 0x210))(_o);
    break;
  case 8:
    (**(code **)(*(long *)_o + 0x218))(_o,_a[1]);
    break;
  case 9:
    (**(code **)(*(long *)_o + 0x220))(_o);
    break;
  case 10:
    (**(code **)(*(long *)_o + 0x228))(_o);
    break;
  case 0xb:
    edit((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
    break;
  case 0xc:
    clearSelection((QAbstractItemView *)_o);
    break;
  case 0xd:
    setCurrentIndex((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
    break;
  case 0xe:
    scrollToTop((QAbstractItemView *)_o);
    break;
  case 0xf:
    scrollToBottom((QAbstractItemView *)_o);
    break;
  case 0x10:
    update((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
    break;
  case 0x11:
    (**(code **)(*(long *)_o + 0x230))(_o,_a[1],_a[2],_a[3]);
    break;
  case 0x12:
    local_48 = (QArrayData *)0x0;
    pvStack_40 = (void *)0x0;
    local_38 = 0;
    (**(code **)(*(long *)_o + 0x230))(_o,_a[1],_a[2],&local_48);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,4,0x10);
      }
    }
    break;
  case 0x13:
    (**(code **)(*(long *)_o + 0x238))(_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0x14:
    (**(code **)(*(long *)_o + 0x240))(_o,_a[1],*_a[2],*_a[3]);
    break;
  case 0x15:
    (**(code **)(*(long *)_o + 0x248))(_o,_a[1],_a[2]);
    break;
  case 0x16:
    (**(code **)(*(long *)_o + 0x250))(_o,_a[1],_a[2]);
    break;
  case 0x17:
    (**(code **)(*(long *)_o + 600))(_o);
    break;
  case 0x18:
    (**(code **)(*(long *)_o + 0x260))(_o);
    break;
  case 0x19:
    (**(code **)(*(long *)_o + 0x268))(_o);
    break;
  case 0x1a:
    (**(code **)(*(long *)_o + 0x270))(_o,*_a[1]);
    break;
  case 0x1b:
    (**(code **)(*(long *)_o + 0x278))(_o,*_a[1]);
    break;
  case 0x1c:
    (**(code **)(*(long *)_o + 0x280))(_o,*_a[1]);
    break;
  case 0x1d:
    (**(code **)(*(long *)_o + 0x288))(_o,*_a[1]);
    break;
  case 0x1e:
    (**(code **)(*(long *)_o + 0x290))(_o,*_a[1],*_a[2]);
    break;
  case 0x1f:
    (**(code **)(*(long *)_o + 0x298))(_o,*_a[1]);
    break;
  case 0x20:
    (**(code **)(*(long *)_o + 0x2a0))(_o,*_a[1]);
  }
  if (_c != ReadProperty) {
    if (_c == IndexOfMethod) {
switchD_00547408_caseD_5:
      plVar2 = (long *)_a[1];
      if (((code *)*plVar2 == pressed) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_00547408_caseD_4;
      }
      if (((code *)*plVar2 == clicked) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_00547408_caseD_4;
      }
      if (((code *)*plVar2 == doubleClicked) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_00547408_caseD_4;
      }
      if (((code *)*plVar2 == activated) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_00547408_caseD_4;
      }
      if (((code *)*plVar2 == entered) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_00547408_caseD_4;
      }
      if (((code *)*plVar2 == viewportEntered) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_00547408_caseD_4;
      }
      if (((code *)*plVar2 == iconSizeChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 6;
        goto switchD_00547408_caseD_4;
      }
      if (_c == ResetProperty) goto switchD_00547408_caseD_3;
      if (_c == WriteProperty) goto switchD_00547408_caseD_2;
      if (_c != ReadProperty) goto switchD_00547408_caseD_4;
      goto switchD_00547408_caseD_1;
    }
    if (_c != RegisterMethodArgumentMetaType) goto LAB_005478c9;
    if (_id < 0x1e) {
      if (_id == 0x11) {
        puVar6 = (undefined8 *)*_a;
        if (*_a[1] != 2) goto LAB_005476f0;
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
      }
      else {
        if (_id != 0x15) goto LAB_005476d3;
        puVar6 = (undefined8 *)*_a;
        if (1 < *_a[1]) goto LAB_005476f0;
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
      }
LAB_005476eb:
      *puVar6 = pIVar8;
    }
    else {
      if ((_id == 0x1e) || (_id == 0x1f)) {
        puVar6 = (undefined8 *)*_a;
        if (*_a[1] != 0) goto LAB_005476f0;
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        goto LAB_005476eb;
      }
LAB_005476d3:
      puVar6 = (undefined8 *)*_a;
LAB_005476f0:
      *puVar6 = 0;
    }
    switch(_c) {
    case ReadProperty:
      break;
    case WriteProperty:
      goto switchD_00547408_caseD_2;
    case ResetProperty:
      goto switchD_00547408_caseD_3;
    default:
      goto switchD_00547408_caseD_4;
    case IndexOfMethod:
      goto switchD_00547408_caseD_5;
    }
  }
switchD_00547408_caseD_1:
  if (0x10 < (uint)_id) goto LAB_005478c9;
  pDVar1 = (DragDropMode *)*_a;
  switch(_id) {
  case 0:
    uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x418);
    goto LAB_005478a9;
  case 1:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x420);
    break;
  case 2:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x3b0);
    break;
  case 3:
    uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x3c8);
    goto LAB_005478a9;
  case 4:
    uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x3c9);
    goto LAB_005478a9;
  case 5:
    uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x3dc);
    goto LAB_005478a9;
  case 6:
    uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x3e4);
    goto LAB_005478a9;
  case 7:
    DVar5 = dragDropMode((QAbstractItemView *)_o);
    break;
  case 8:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x3ec);
    break;
  case 9:
    uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x42a);
LAB_005478a9:
    *(undefined1 *)pDVar1 = uVar4;
    goto LAB_005478c9;
  case 10:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x338);
    break;
  case 0xb:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x33c);
    break;
  case 0xc:
    *(undefined8 *)pDVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x42c);
    goto LAB_005478c9;
  case 0xd:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x434);
    break;
  case 0xe:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x458);
    break;
  case 0xf:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x45c);
    break;
  case 0x10:
    DVar5 = *(DragDropMode *)(*(long *)(_o + 8) + 0x498);
  }
  *pDVar1 = DVar5;
LAB_005478c9:
  if (_c != ResetProperty) {
    if (_c != WriteProperty) goto switchD_00547408_caseD_4;
switchD_00547408_caseD_2:
    if ((uint)_id < 0x11) {
      size = (QSize *)*_a;
      switch(_id) {
      case 0:
        *(char *)(*(long *)(_o + 8) + 0x418) = (char)(size->wd).m_i;
        break;
      case 1:
        *(int *)(*(long *)(_o + 8) + 0x420) = (size->wd).m_i;
        break;
      case 2:
        *(int *)(*(long *)(_o + 8) + 0x3b0) = (size->wd).m_i;
        break;
      case 3:
        *(char *)(*(long *)(_o + 8) + 0x3c8) = (char)(size->wd).m_i;
        break;
      case 4:
        *(char *)(*(long *)(_o + 8) + 0x3c9) = (char)(size->wd).m_i;
        break;
      case 5:
        *(char *)(*(long *)(_o + 8) + 0x3dc) = (char)(size->wd).m_i;
        break;
      case 6:
        *(char *)(*(long *)(_o + 8) + 0x3e4) = (char)(size->wd).m_i;
        break;
      case 7:
        setDragDropMode((QAbstractItemView *)_o,(size->wd).m_i);
        break;
      case 8:
        *(int *)(*(long *)(_o + 8) + 0x3ec) = (size->wd).m_i;
        break;
      case 9:
        lVar3 = *(long *)(_o + 8);
        *(char *)(lVar3 + 0x42a) = (char)(size->wd).m_i;
        if ((*(byte *)(*(long *)(_o + 0x20) + 9) & 0x80) != 0) {
          QWidget::update(*(QWidget **)(lVar3 + 0x2b0));
        }
        break;
      case 10:
        *(int *)(*(long *)(_o + 8) + 0x338) = (size->wd).m_i;
        break;
      case 0xb:
        *(int *)(*(long *)(_o + 8) + 0x33c) = (size->wd).m_i;
        break;
      case 0xc:
        setIconSize((QAbstractItemView *)_o,size);
        break;
      case 0xd:
        *(int *)(*(long *)(_o + 8) + 0x434) = (size->wd).m_i;
        break;
      case 0xe:
        setVerticalScrollMode((QAbstractItemView *)_o,(size->wd).m_i);
        break;
      case 0xf:
        setHorizontalScrollMode((QAbstractItemView *)_o,(size->wd).m_i);
        break;
      case 0x10:
        iVar9 = (size->wd).m_i;
        if (*(int *)(*(long *)(_o + 8) + 0x498) != iVar9) {
          *(int *)(*(long *)(_o + 8) + 0x498) = iVar9;
        }
      }
    }
    if (_c != ResetProperty) goto switchD_00547408_caseD_4;
  }
switchD_00547408_caseD_3:
  if (_id == 0xf) {
    resetHorizontalScrollMode((QAbstractItemView *)_o);
  }
  else if (_id == 0xe) {
    resetVerticalScrollMode((QAbstractItemView *)_o);
  }
switchD_00547408_caseD_4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pressed((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->clicked((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->doubleClicked((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 3: _t->activated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->entered((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 5: _t->viewportEntered(); break;
        case 6: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 7: _t->reset(); break;
        case 8: _t->setRootIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 9: _t->doItemsLayout(); break;
        case 10: _t->selectAll(); break;
        case 11: _t->edit((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 12: _t->clearSelection(); break;
        case 13: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 14: _t->scrollToTop(); break;
        case 15: _t->scrollToBottom(); break;
        case 16: _t->update((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 17: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 18: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 19: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 20: _t->rowsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 21: _t->selectionChanged((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[2]))); break;
        case 22: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 23: _t->updateEditorData(); break;
        case 24: _t->updateEditorGeometries(); break;
        case 25: _t->updateGeometries(); break;
        case 26: _t->verticalScrollbarAction((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 27: _t->horizontalScrollbarAction((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 28: _t->verticalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 29: _t->horizontalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 30: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemDelegate::EndEditHint>>(_a[2]))); break;
        case 31: _t->commitData((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 32: _t->editorDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        case 30:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 31:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::pressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::clicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::doubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::activated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::entered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)()>(_a, &QAbstractItemView::viewportEntered, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QSize & )>(_a, &QAbstractItemView::iconSizeChanged, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->hasAutoScroll(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->autoScrollMargin(); break;
        case 2: QtMocHelpers::assignFlags<EditTriggers>(_v, _t->editTriggers()); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->tabKeyNavigation(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->showDropIndicator(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->dragEnabled(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->dragDropOverwriteMode(); break;
        case 7: *reinterpret_cast<DragDropMode*>(_v) = _t->dragDropMode(); break;
        case 8: *reinterpret_cast<Qt::DropAction*>(_v) = _t->defaultDropAction(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->alternatingRowColors(); break;
        case 10: *reinterpret_cast<SelectionMode*>(_v) = _t->selectionMode(); break;
        case 11: *reinterpret_cast<SelectionBehavior*>(_v) = _t->selectionBehavior(); break;
        case 12: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 13: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->textElideMode(); break;
        case 14: *reinterpret_cast<ScrollMode*>(_v) = _t->verticalScrollMode(); break;
        case 15: *reinterpret_cast<ScrollMode*>(_v) = _t->horizontalScrollMode(); break;
        case 16: *reinterpret_cast<int*>(_v) = _t->updateThreshold(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoScroll(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setAutoScrollMargin(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setEditTriggers(*reinterpret_cast<EditTriggers*>(_v)); break;
        case 3: _t->setTabKeyNavigation(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setDropIndicatorShown(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setDragEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setDragDropOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setDragDropMode(*reinterpret_cast<DragDropMode*>(_v)); break;
        case 8: _t->setDefaultDropAction(*reinterpret_cast<Qt::DropAction*>(_v)); break;
        case 9: _t->setAlternatingRowColors(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setSelectionMode(*reinterpret_cast<SelectionMode*>(_v)); break;
        case 11: _t->setSelectionBehavior(*reinterpret_cast<SelectionBehavior*>(_v)); break;
        case 12: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 13: _t->setTextElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 14: _t->setVerticalScrollMode(*reinterpret_cast<ScrollMode*>(_v)); break;
        case 15: _t->setHorizontalScrollMode(*reinterpret_cast<ScrollMode*>(_v)); break;
        case 16: _t->setUpdateThreshold(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 14: _t->resetVerticalScrollMode(); break;
        case 15: _t->resetHorizontalScrollMode(); break;
        default: break;
        }
    }
}